

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O2

b_tree_node * __thiscall
b_tree::_copy_arm(b_tree_node *__return_storage_ptr__,b_tree *this,int64_t key,int64_t node_ofs)

{
  ushort uVar1;
  size_t __n;
  long lVar2;
  pair<unsigned_char_*,_unsigned_char_*> pVar3;
  pair<unsigned_char_*,_unsigned_char_*> pVar4;
  b_tree_node current_node;
  b_tree_node child_node;
  b_tree_node local_100;
  b_tree_node local_98;
  
  b_tree_node::b_tree_node(&local_100,&this->_p,node_ofs);
  b_tree_node::b_tree_node
            (__return_storage_ptr__,&this->_p,*local_100._min_degree_field,
             *local_100._leaf_field != 0);
  printf("%ld ",__return_storage_ptr__->_ofs_field);
  pVar3 = r_memory_map::map(&__return_storage_ptr__->_mm);
  pVar4 = r_memory_map::map(&local_100._mm);
  __n = pager::block_size();
  memcpy(pVar3.first,pVar4.first,__n);
  uVar1 = *local_100._num_keys_field;
  lVar2 = 0;
  do {
    if ((uint)uVar1 == (uint)lVar2) {
LAB_00107468:
      if (*local_100._leaf_field == 0) {
        _copy_arm(&local_98,this,key,local_100._child_ofs_field[uVar1]);
        __return_storage_ptr__->_child_ofs_field[uVar1] = local_98._ofs_field;
        r_memory_map::~r_memory_map(&local_98._mm);
      }
      r_memory_map::~r_memory_map(&local_100._mm);
      return __return_storage_ptr__;
    }
    if (key <= local_100._keys_field[lVar2]) {
      uVar1 = (ushort)lVar2;
      goto LAB_00107468;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

b_tree_node b_tree::_copy_arm(int64_t key, int64_t node_ofs)
{
    b_tree_node current_node(_p, node_ofs);
    b_tree_node new_node(_p, current_node._min_degree(), current_node._leaf());

    printf("%ld ", new_node._ofs());

    // Copy keys, values, and valid flags from the current node to the new node
    memcpy(new_node._mm.map().first, current_node._mm.map().first, _p.block_size());

    int i = 0;
    while (i < current_node._num_keys() && key > current_node._key(i))
        i++;

    // If the current node is a leaf, return the new node
    if (current_node._leaf())
        return new_node;

    // If the current node is an internal node, recursively copy the child arm
    b_tree_node child_node = _copy_arm(key, current_node._child_ofs(i));

    // Update the child offset in the new node to point to the copied child arm
    new_node._set_child_ofs(i, child_node._ofs());

    return new_node;
}